

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O2

void __thiscall
pbrt::GoniometricLight::GoniometricLight
          (GoniometricLight *this,Transform *renderFromLight,MediumInterface *mediumInterface,
          SpectrumHandle *Iemit,Float scale,Image *im,Allocator alloc)

{
  PiecewiseConstant2D *this_00;
  Tuple2<pbrt::Point2,_int> TVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  Allocator alloc_00;
  size_t sVar5;
  long in_FS_OFFSET;
  Array2D<float> d;
  TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
  local_b8;
  int va;
  
  LightBase::LightBase(&this->super_LightBase,DeltaPosition,renderFromLight,mediumInterface);
  local_b8.bits =
       (Iemit->
       super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBAlbedoSpectrum,_pbrt::RGBUnboundedSpectrum,_pbrt::RGBIlluminantSpectrum,_pbrt::BlackbodySpectrum>
       ).bits;
  DenselySampledSpectrum::DenselySampledSpectrum(&this->Iemit,(SpectrumHandle *)&local_b8,alloc);
  this->scale = scale;
  Image::Image(&this->image,im);
  this_00 = &this->distrib;
  PiecewiseConstant2D::PiecewiseConstant2D(this_00,alloc);
  va = 1;
  d.extent.pMin.super_Tuple2<pbrt::Point2,_int>.x = (int)(this->image).channelNames.nStored;
  if (d.extent.pMin.super_Tuple2<pbrt::Point2,_int>.x != 1) {
    LogFatal<char_const(&)[2],char_const(&)[18],char_const(&)[2],int&,char_const(&)[18],int&>
              (Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/lights.cpp"
               ,0x1ea,"Check failed: %s == %s with %s = %s, %s = %s",(char (*) [2])0x2c93214,
               (char (*) [18])"image.NChannels()",(char (*) [2])0x2c93214,&va,
               (char (*) [18])"image.NChannels()",(int *)&d);
  }
  TVar1 = (this->image).resolution.super_Tuple2<pbrt::Point2,_int>;
  va = TVar1.x;
  d.extent.pMin.super_Tuple2<pbrt::Point2,_int>.x = TVar1.y;
  if (va == d.extent.pMin.super_Tuple2<pbrt::Point2,_int>.x) {
    Image::GetSamplingDistribution(&d,&this->image);
    alloc_00.memoryResource = pstd::pmr::new_delete_resource();
    PiecewiseConstant2D::PiecewiseConstant2D((PiecewiseConstant2D *)&va,&d,alloc_00);
    PiecewiseConstant2D::operator=(this_00,(PiecewiseConstant2D *)&va);
    PiecewiseConstant2D::~PiecewiseConstant2D((PiecewiseConstant2D *)&va);
    sVar2 = (this->image).p8.nStored;
    sVar3 = (this->image).p16.nStored;
    sVar4 = (this->image).p32.nStored;
    sVar5 = PiecewiseConstant2D::BytesUsed(this_00);
    *(long *)(in_FS_OFFSET + -0x220) =
         *(long *)(in_FS_OFFSET + -0x220) + sVar2 + sVar3 * 2 + sVar4 * 4 + sVar5;
    Array2D<float>::~Array2D(&d);
    return;
  }
  LogFatal<char_const(&)[21],char_const(&)[21],char_const(&)[21],int&,char_const(&)[21],int&>
            (Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/lights.cpp"
             ,0x1eb,"Check failed: %s == %s with %s = %s, %s = %s",
             (char (*) [21])"image.Resolution().x",(char (*) [21])"image.Resolution().y",
             (char (*) [21])"image.Resolution().x",&va,(char (*) [21])"image.Resolution().y",
             (int *)&d);
}

Assistant:

GoniometricLight::GoniometricLight(const Transform &renderFromLight,
                                   const MediumInterface &mediumInterface,
                                   SpectrumHandle Iemit, Float scale, Image im,
                                   Allocator alloc)
    : LightBase(LightType::DeltaPosition, renderFromLight, mediumInterface),
      Iemit(Iemit, alloc),
      scale(scale),
      image(std::move(im)),
      distrib(alloc) {
    CHECK_EQ(1, image.NChannels());
    CHECK_EQ(image.Resolution().x, image.Resolution().y);
    // Compute sampling distribution for _GoniometricLight_
    Array2D<Float> d = image.GetSamplingDistribution();
    distrib = PiecewiseConstant2D(d);

    imageBytes += image.BytesUsed() + distrib.BytesUsed();
}